

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface.c
# Opt level: O1

int run_test_udp_multicast_interface(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar7;
  bool bVar8;
  uv_udp_t *puVar9;
  uv_handle_t *handle;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b;
  sockaddr_in baddr;
  sockaddr_in addr;
  uv_udp_send_t req;
  undefined1 auStack_1b8 [40];
  uv_handle_t *local_190;
  undefined1 local_188 [8];
  uv_buf_t local_180;
  sockaddr_in local_170;
  sockaddr_in local_160;
  uv_udp_send_t local_150;
  
  local_180.len = (size_t)local_180.base;
  auStack_1b8._24_8_ = (uv_close_cb)0x1d963e;
  iVar6 = uv_ip4_addr("239.255.0.1",0x23a3,&local_160);
  local_150.data = (void *)(long)iVar6;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_180.len;
  local_180 = (uv_buf_t)(auVar5 << 0x40);
  if (local_150.data == (void *)0x0) {
    auStack_1b8._24_8_ = (uv_close_cb)0x1d9663;
    puVar7 = uv_default_loop();
    auStack_1b8._24_8_ = (uv_close_cb)0x1d9672;
    iVar6 = uv_udp_init(puVar7,&server);
    local_150.data = (void *)(long)iVar6;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_180.len;
    local_180 = (uv_buf_t)(auVar1 << 0x40);
    if (local_150.data != (void *)0x0) goto LAB_001d98e0;
    auStack_1b8._24_8_ = (uv_close_cb)0x1d96a5;
    iVar6 = uv_ip4_addr("0.0.0.0",0,&local_170);
    local_150.data = (void *)(long)iVar6;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_180.len;
    local_180 = (uv_buf_t)(auVar2 << 0x40);
    if (local_150.data != (void *)0x0) goto LAB_001d98ef;
    auStack_1b8._24_8_ = (uv_close_cb)0x1d96d8;
    iVar6 = uv_udp_bind(&server,(sockaddr *)&local_170,0);
    local_150.data = (void *)(long)iVar6;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_180.len;
    local_180 = (uv_buf_t)(auVar3 << 0x40);
    if (local_150.data != (void *)0x0) goto LAB_001d98fe;
    auStack_1b8._24_8_ = (uv_close_cb)0x1d970b;
    iVar6 = uv_udp_set_multicast_interface(&server,"0.0.0.0");
    local_150.data = (void *)(long)iVar6;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_180.len;
    local_180 = (uv_buf_t)(auVar4 << 0x40);
    if (local_150.data != (void *)0x0) goto LAB_001d990d;
    auStack_1b8._24_8_ = (uv_close_cb)0x1d973c;
    local_180 = uv_buf_init("PING",4);
    auStack_1b8._24_8_ = (uv_close_cb)0x1d976d;
    iVar6 = uv_udp_send(&local_150,&server,&local_180,1,(sockaddr *)&local_160,sv_send_cb);
    local_188 = (undefined1  [8])(long)iVar6;
    local_190 = (uv_handle_t *)0x0;
    if (local_188 != (undefined1  [8])0x0) goto LAB_001d991c;
    local_188 = (undefined1  [8])(long)close_cb_called;
    local_190 = (uv_handle_t *)0x0;
    if (local_188 != (undefined1  [8])0x0) goto LAB_001d992b;
    local_188 = (undefined1  [8])(long)sv_send_cb_called;
    local_190 = (uv_handle_t *)0x0;
    if (local_188 != (undefined1  [8])0x0) goto LAB_001d993a;
    auStack_1b8._24_8_ = (uv_close_cb)0x1d97dc;
    puVar7 = uv_default_loop();
    auStack_1b8._24_8_ = (uv_close_cb)0x1d97e6;
    uv_run(puVar7,UV_RUN_DEFAULT);
    local_188 = (undefined1  [8])0x1;
    local_190 = (uv_handle_t *)(long)sv_send_cb_called;
    if (local_190 != (uv_handle_t *)0x1) goto LAB_001d9949;
    local_188 = (undefined1  [8])0x1;
    local_190 = (uv_handle_t *)(long)close_cb_called;
    if (local_190 != (uv_handle_t *)0x1) goto LAB_001d9958;
    local_188 = (undefined1  [8])server.send_queue_size;
    local_190 = (uv_handle_t *)0x0;
    if (server.send_queue_size != 0) goto LAB_001d9976;
    auStack_1b8._24_8_ = (uv_close_cb)0x1d9876;
    puVar7 = uv_default_loop();
    auStack_1b8._24_8_ = (uv_close_cb)0x1d988a;
    uv_walk(puVar7,close_walk_cb,(void *)0x0);
    auStack_1b8._24_8_ = (uv_close_cb)0x1d9894;
    uv_run(puVar7,UV_RUN_DEFAULT);
    local_188 = (undefined1  [8])0x0;
    auStack_1b8._24_8_ = (uv_close_cb)0x1d98a2;
    puVar7 = uv_default_loop();
    auStack_1b8._24_8_ = (uv_close_cb)0x1d98aa;
    iVar6 = uv_loop_close(puVar7);
    local_190 = (uv_handle_t *)(long)iVar6;
    if (local_188 == (undefined1  [8])local_190) {
      auStack_1b8._24_8_ = (uv_close_cb)0x1d98c6;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_1b8._24_8_ = (uv_close_cb)0x1d98e0;
    run_test_udp_multicast_interface_cold_1();
LAB_001d98e0:
    auStack_1b8._24_8_ = (uv_close_cb)0x1d98ef;
    run_test_udp_multicast_interface_cold_2();
LAB_001d98ef:
    auStack_1b8._24_8_ = (uv_close_cb)0x1d98fe;
    run_test_udp_multicast_interface_cold_3();
LAB_001d98fe:
    auStack_1b8._24_8_ = (uv_close_cb)0x1d990d;
    run_test_udp_multicast_interface_cold_4();
LAB_001d990d:
    auStack_1b8._24_8_ = (uv_close_cb)0x1d991c;
    run_test_udp_multicast_interface_cold_5();
LAB_001d991c:
    auStack_1b8._24_8_ = (uv_close_cb)0x1d992b;
    run_test_udp_multicast_interface_cold_6();
LAB_001d992b:
    auStack_1b8._24_8_ = (uv_close_cb)0x1d993a;
    run_test_udp_multicast_interface_cold_7();
LAB_001d993a:
    auStack_1b8._24_8_ = (uv_close_cb)0x1d9949;
    run_test_udp_multicast_interface_cold_8();
LAB_001d9949:
    auStack_1b8._24_8_ = (uv_close_cb)0x1d9958;
    run_test_udp_multicast_interface_cold_9();
LAB_001d9958:
    auStack_1b8._24_8_ = (uv_close_cb)0x1d9967;
    run_test_udp_multicast_interface_cold_10();
    auStack_1b8._24_8_ = (uv_close_cb)0x1d9976;
    run_test_udp_multicast_interface_cold_11();
LAB_001d9976:
    auStack_1b8._24_8_ = (uv_close_cb)0x1d9985;
    run_test_udp_multicast_interface_cold_12();
  }
  puVar9 = (uv_udp_t *)(auStack_1b8 + 0x30);
  iVar6 = (int)auStack_1b8 + 0x28;
  auStack_1b8._24_8_ = sv_send_cb;
  run_test_udp_multicast_interface_cold_13();
  if (puVar9 == (uv_udp_t *)0x0) {
    auStack_1b8._0_8_ = (void *)0x1d9a02;
    sv_send_cb_cold_3();
  }
  else {
    if ((1 < iVar6 + 1U) && (iVar6 != -0x65)) goto LAB_001d9a11;
    puVar9 = (uv_udp_t *)puVar9->send_queue_count;
    auStack_1b8._24_8_ = ZEXT18(puVar9 == &client || puVar9 == &server);
    auStack_1b8._16_8_ = 0;
    if ((uv_close_cb)auStack_1b8._24_8_ != (uv_close_cb)0x0) {
      sv_send_cb_called = sv_send_cb_called + 1;
      uv_close((uv_handle_t *)puVar9,close_cb);
      return extraout_EAX;
    }
  }
  puVar9 = (uv_udp_t *)(auStack_1b8 + 0x18);
  auStack_1b8._0_8_ = (void *)0x1d9a11;
  sv_send_cb_cold_1();
LAB_001d9a11:
  auStack_1b8._0_8_ = close_cb;
  sv_send_cb_cold_2();
  bVar8 = puVar9 == &client || puVar9 == &server;
  auStack_1b8._0_8_ = ZEXT18(bVar8);
  if ((void *)auStack_1b8._0_8_ != (void *)0x0) {
    close_cb_called = close_cb_called + 1;
    return (int)bVar8;
  }
  handle = (uv_handle_t *)auStack_1b8;
  close_cb_cold_1();
  iVar6 = uv_is_closing(handle);
  if (iVar6 == 0) {
    uv_close(handle,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return iVar6;
}

Assistant:

TEST_IMPL(udp_multicast_interface) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in addr;
  struct sockaddr_in baddr;

  ASSERT_OK(uv_ip4_addr("239.255.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("0.0.0.0", 0, &baddr));
  r = uv_udp_bind(&server, (const struct sockaddr*)&baddr, 0);
  ASSERT_OK(r);

  r = uv_udp_set_multicast_interface(&server, "0.0.0.0");
  ASSERT_OK(r);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*)&addr,
                  sv_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(sv_send_cb_called);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, close_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}